

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O1

void test_base_z5_row_access<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false>>>
               (void)

{
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *__args_1;
  pointer ppVar1;
  pointer ppVar2;
  pointer puVar3;
  pointer pvVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  Column_zp_settings *this;
  _Rb_tree_header *p_Var7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  size_type __n;
  pointer witness;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_00;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_01;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_02;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_03;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_04;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  rows;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  columns;
  Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>
  m;
  allocator_type local_e1;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_e0;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  local_c8;
  undefined1 local_b0 [16];
  _Base_ptr local_a0;
  _Base_ptr p_Stack_98;
  _Base_ptr local_90;
  size_t sStack_88;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  local_80;
  undefined1 local_68 [16];
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>_>_>
  local_58;
  Index local_40;
  Column_zp_settings *local_38;
  
  build_general_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false>>>>
            ();
  this = (Column_zp_settings *)operator_new(0x58);
  Gudhi::persistence_matrix::
  Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>
  ::Column_zp_settings::Column_zp_settings(this,5);
  local_68._0_8_ = this;
  local_68._8_8_ = operator_new(0x30);
  p_Var7 = &(((map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>_>_>_>_>_>
               *)local_68._8_8_)->_M_t)._M_impl.super__Rb_tree_header;
  (((map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>_>_>_>_>_>
     *)local_68._8_8_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (((map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>_>_>_>_>_>
     *)local_68._8_8_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (((map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>_>_>_>_>_>
     *)local_68._8_8_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (((map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>_>_>_>_>_>
     *)local_68._8_8_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)
   &(((map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>_>_>_>_>_>
       *)local_68._8_8_)->_M_t)._M_impl = 0;
  *(undefined8 *)
   &(((map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>_>_>_>_>_>
       *)local_68._8_8_)->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  (((map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>_>_>_>_>_>
     *)local_68._8_8_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var7->_M_header;
  (((map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>_>_>_>_>_>
     *)local_68._8_8_)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var7->_M_header;
  (((map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>_>_>_>_>_>
     *)local_68._8_8_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58.
  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n = ((long)local_80.
               super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)local_80.
               super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  local_40 = (Index)__n;
  local_38 = this;
  std::
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>_>_>
  ::reserve(&local_58,__n);
  if (local_80.
      super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_80.
      super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar10 = 1;
    uVar8 = 0;
    do {
      __args_1 = local_80.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar8;
      ppVar1 = (__args_1->
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      ppVar2 = (__args_1->
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      iVar11 = (int)((ulong)((long)ppVar1 - (long)ppVar2) >> 3) + -1;
      if (ppVar1 == ppVar2) {
        iVar11 = 0;
      }
      local_b0._0_4_ = uVar10 - 1;
      local_c8.
      super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_c8.
                             super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar11);
      std::
      vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false>>>>>
      ::
      emplace_back<unsigned_int&,std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>const&,int&,std::map<unsigned_int,std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false>>>,Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false>>::RowEntryComp,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false>>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false>>>,Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false>>::RowEntryComp,std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false>>>>>>>>*&,Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false>>::Column_zp_settings*&>
                ((vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false>>>>>
                  *)&local_58,(uint *)local_b0,__args_1,(int *)&local_c8,
                 (map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>_>_>_>_>_>
                  **)(local_68 + 8),&local_38);
      uVar8 = (ulong)uVar10;
      uVar9 = ((long)local_80.
                     super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_80.
                     super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      uVar10 = uVar10 + 1;
    } while (uVar8 <= uVar9 && uVar9 - uVar8 != 0);
  }
  local_c8.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>_>
        *)0x0;
  local_c8.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (witness_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>_>
        *)0x0;
  local_c8.
  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b0._0_4_ = 3;
  local_b0._4_4_ = 1;
  local_b0._8_8_ = (pointer)0x100000006;
  local_a0 = (_Base_ptr)0x100000009;
  p_Stack_98 = (_Base_ptr)0x10000000a;
  local_90 = (_Base_ptr)0x10000000b;
  __l._M_len = 5;
  __l._M_array = (iterator)local_b0;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_e0,__l,&local_e1);
  std::
  vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
  ::
  emplace_back<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
              *)&local_c8,&local_e0);
  if ((pair<unsigned_int,_unsigned_int>)
      local_e0.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pair<unsigned_int,_unsigned_int>)0x0) {
    operator_delete(local_e0.
                    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e0.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_b0._0_4_ = 3;
  local_b0._4_4_ = 4;
  local_b0._8_8_ = (pointer)0x100000005;
  local_a0 = (_Base_ptr)0x100000008;
  p_Stack_98 = (_Base_ptr)0x400000009;
  local_90 = (_Base_ptr)0x40000000b;
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)local_b0;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_e0,__l_00,&local_e1);
  std::
  vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
  ::
  emplace_back<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
              *)&local_c8,&local_e0);
  if ((pair<unsigned_int,_unsigned_int>)
      local_e0.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pair<unsigned_int,_unsigned_int>)0x0) {
    operator_delete(local_e0.
                    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e0.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_e0.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x400000005;
  local_e0.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x400000008;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&local_e0;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)local_b0,__l_01,&local_e1);
  std::
  vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
  ::
  emplace_back<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
              *)&local_c8,
             (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)local_b0);
  if ((pair<unsigned_int,_unsigned_int>)local_b0._0_8_ != (pair<unsigned_int,_unsigned_int>)0x0) {
    operator_delete((void *)local_b0._0_8_,(long)local_a0 - local_b0._0_8_);
  }
  local_e0.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x100000007;
  __l_02._M_len = 1;
  __l_02._M_array = (iterator)&local_e0;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)local_b0,__l_02,&local_e1);
  std::
  vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
  ::
  emplace_back<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
              *)&local_c8,
             (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)local_b0);
  if ((pair<unsigned_int,_unsigned_int>)local_b0._0_8_ != (pair<unsigned_int,_unsigned_int>)0x0) {
    operator_delete((void *)local_b0._0_8_,(long)local_a0 - local_b0._0_8_);
  }
  local_b0._0_4_ = 3;
  local_b0._4_4_ = 1;
  local_b0._8_8_ = (pointer)0x400000006;
  local_a0 = (_Base_ptr)0x100000007;
  p_Stack_98 = (_Base_ptr)0x100000009;
  local_90 = (_Base_ptr)0x40000000a;
  sStack_88 = 0x10000000b;
  __l_03._M_len = 6;
  __l_03._M_array = (iterator)local_b0;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(&local_e0,__l_03,&local_e1);
  std::
  vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
  ::
  emplace_back<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
              *)&local_c8,&local_e0);
  if ((pair<unsigned_int,_unsigned_int>)
      local_e0.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pair<unsigned_int,_unsigned_int>)0x0) {
    operator_delete(local_e0.
                    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e0.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e0.
                          super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  local_e0.
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x400000007;
  __l_04._M_len = 1;
  __l_04._M_array = (iterator)&local_e0;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)local_b0,__l_04,&local_e1);
  std::
  vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
  ::
  emplace_back<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>>
              *)&local_c8,
             (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
              *)local_b0);
  if ((pair<unsigned_int,_unsigned_int>)local_b0._0_8_ != (pair<unsigned_int,_unsigned_int>)0x0) {
    operator_delete((void *)local_b0._0_8_,(long)local_a0 - local_b0._0_8_);
  }
  pvVar4 = local_c8.
           super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_c8.
      super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_c8.
      super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar10 = 0;
    witness = local_c8.
              super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      get_ordered_row<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false>>>
                ((column_content<typename_Matrix<Base_options_with_row_access<false,_(Column_types)7,_true,_false,_false,_false>_>::Column>
                  *)local_b0,
                 (Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>
                  *)local_68,uVar10);
      test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,false,false>>>>
                (witness,(column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>_>
                          *)local_b0);
      std::
      _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::~_Rb_tree((_Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)local_b0);
      witness = witness + 1;
      uVar10 = uVar10 + 1;
    } while (witness != pvVar4);
  }
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector(&local_c8);
  uVar5 = local_68._0_8_;
  std::
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>_>_>
  ::_M_erase_at_end(&local_58,
                    local_58.
                    super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  uVar6 = local_68._0_8_;
  local_40 = 0;
  local_38 = (Column_zp_settings *)uVar5;
  if ((Column_zp_settings *)local_68._0_8_ != (Column_zp_settings *)0x0) {
    boost::pool<boost::default_user_allocator_malloc_free>::purge_memory
              ((pool<boost::default_user_allocator_malloc_free> *)(local_68._0_8_ + 0x20));
    puVar3 = (((Field_operators *)uVar6)->inverse_).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar3 != (pointer)0x0) {
      operator_delete(puVar3,(long)(((Field_operators *)uVar6)->inverse_).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar3)
      ;
    }
    operator_delete((void *)uVar6,0x58);
  }
  std::
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>_>_>
  ::~vector(&local_58);
  Gudhi::persistence_matrix::
  Matrix_row_access<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>_>_>,_std::map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>_>_>_>_>_>,_true,_unsigned_int>
  ::~Matrix_row_access
            ((Matrix_row_access<std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>_>_>,_std::map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>,_Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>::RowEntryComp,_std::allocator<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_false>_>_>_>_>_>_>_>,_true,_unsigned_int>
              *)(local_68 + 8));
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector(&local_80);
  return;
}

Assistant:

void test_base_z5_row_access() {
  auto columns = build_general_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  std::vector<std::vector<std::pair<unsigned int, typename Matrix::Element> > > rows;
  if constexpr (Matrix::Option_list::has_column_compression) {
    // if the union find structure changes, the column_index values of the entries could also change. Change the test
    // with all possibilities?
    rows.push_back({{3, 1}, {6, 1}});
    rows.push_back({{3, 4}, {5, 1}});
    rows.push_back({{5, 4}});
    rows.push_back({{7, 1}});
    rows.push_back({{3, 1}, {6, 4}, {7, 1}});
    rows.push_back({{7, 4}});
  } else {
    rows.push_back({{3, 1}, {6, 1}, {9, 1}, {10, 1}, {11, 1}});
    rows.push_back({{3, 4}, {5, 1}, {8, 1}, {9, 4}, {11, 4}});
    rows.push_back({{5, 4}, {8, 4}});
    rows.push_back({{7, 1}});
    rows.push_back({{3, 1}, {6, 4}, {7, 1}, {9, 1}, {10, 4}, {11, 1}});
    rows.push_back({{7, 4}});
  }

  unsigned int i = 0;
  for (auto& r : rows) {
    test_column_equality<typename Matrix::Column>(r, get_ordered_row(m, i++));
  }
}